

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O1

void CheckTarget(TidyDocImpl *doc,Node *node,AttVal *attval)

{
  Bool BVar1;
  uint code;
  
  if ((attval != (AttVal *)0x0) && (attval->value != (char *)0x0)) {
    BVar1 = prvTidyIsLetter((int)*attval->value);
    if (BVar1 == no) {
      BVar1 = AttrValueIsAmong(attval,&PTR_anon_var_dwarf_812_001c8190);
      if (BVar1 == no) {
        code = 0x22b;
        goto LAB_0013e6e7;
      }
    }
    return;
  }
  code = 0x256;
LAB_0013e6e7:
  prvTidyReportAttrError(doc,node,attval,code);
  return;
}

Assistant:

void CheckTarget( TidyDocImpl* doc, Node *node, AttVal *attval)
{
    ctmbstr const values[] = {"_blank", "_self", "_parent", "_top", NULL};

    if (!AttrHasValue(attval))
    {
        TY_(ReportAttrError)( doc, node, attval, MISSING_ATTR_VALUE);
        return;
    }

    /* target names must begin with A-Za-z ... */
    if (TY_(IsLetter)(attval->value[0]))
        return;

    /* or be one of the allowed list */
    if (!AttrValueIsAmong(attval, values))
        TY_(ReportAttrError)( doc, node, attval, BAD_ATTRIBUTE_VALUE);
}